

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

uint av1_get_perpixel_variance
               (AV1_COMP *cpi,MACROBLOCKD *xd,buf_2d *ref,BLOCK_SIZE bsize,int plane,int use_hbd)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  uint8_t *puVar3;
  uint sse;
  uint local_c;
  
  BVar1 = av1_ss_size_lookup[CONCAT71(in_register_00000009,bsize) & 0xffffffff]
          [xd->plane[plane].subsampling_x][xd->plane[plane].subsampling_y];
  if (use_hbd == 0) {
    puVar3 = AV1_VAR_OFFS;
  }
  else {
    puVar3 = (uint8_t *)
             ((ulong)(get_var_offs_high_var_offs_rel +
                     *(int *)(get_var_offs_high_var_offs_rel + (long)(xd->bd + -8 >> 1) * 4)) >> 1);
  }
  uVar2 = (*cpi->ppi->fn_ptr[BVar1].vf)(ref->buf,ref->stride,puVar3,0,&local_c);
  return uVar2 + ((1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar1] & 0x1f)
                  ) >> 1) >>
         ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar1] & 0x1f);
}

Assistant:

unsigned int av1_get_perpixel_variance(const AV1_COMP *cpi,
                                       const MACROBLOCKD *xd,
                                       const struct buf_2d *ref,
                                       BLOCK_SIZE bsize, int plane,
                                       int use_hbd) {
  const int subsampling_x = xd->plane[plane].subsampling_x;
  const int subsampling_y = xd->plane[plane].subsampling_y;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, subsampling_x, subsampling_y);
  unsigned int sse;
  const unsigned int var = cpi->ppi->fn_ptr[plane_bsize].vf(
      ref->buf, ref->stride, get_var_offs(use_hbd, xd->bd), 0, &sse);
  return ROUND_POWER_OF_TWO(var, num_pels_log2_lookup[plane_bsize]);
}